

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wstring * PDA::Transducer::Generator::call(wstring *__return_storage_ptr__,wstring *label)

{
  allocator<wchar_t> local_1a;
  undefined1 local_19;
  wstring *local_18;
  wstring *label_local;
  wstring *result;
  
  local_19 = 0;
  local_18 = label;
  label_local = __return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"call\t",&local_1a);
  std::allocator<wchar_t>::~allocator(&local_1a);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(wstring *)local_18);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::call(const std::wstring &label)
{
    std::wstring result = L"call\t";
    result += label;
    return result;
}